

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O2

string * __thiscall
deqp::gls::LifetimeTests::details::attacherName_abi_cxx11_
          (string *__return_storage_ptr__,details *this,Attacher *attacher)

{
  char *pcVar1;
  ostream *poVar2;
  ostringstream os;
  ostream local_190;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  pcVar1 = (char *)(**(code **)(**(long **)(this + 0x30) + 0x38))();
  poVar2 = std::operator<<(&local_190,pcVar1);
  poVar2 = std::operator<<(poVar2,"_");
  pcVar1 = (char *)(**(code **)(**(long **)(this + 0x38) + 0x38))();
  std::operator<<(poVar2,pcVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  return __return_storage_ptr__;
}

Assistant:

string attacherName (Attacher& attacher)
{
	ostringstream os;
	os << attacher.getElementType().getName() << "_" <<  attacher.getContainerType().getName();
	return os.str();
}